

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

ndn_unix_face_t * ndn_unix_slave_face_construct(int sock)

{
  int iVar1;
  ndn_msg *pnVar2;
  int iret;
  ndn_unix_face_t *ret;
  ndn_unix_face_t *pnStack_10;
  int sock_local;
  
  pnStack_10 = (ndn_unix_face_t *)malloc(0x10b0);
  if (pnStack_10 == (ndn_unix_face_t *)0x0) {
    pnStack_10 = (ndn_unix_face_t *)0x0;
  }
  else {
    (pnStack_10->intf).face_id = 0xffff;
    iVar1 = ndn_forwarder_register_face((ndn_face_intf_t *)pnStack_10);
    if (iVar1 == 0) {
      (pnStack_10->intf).type = '\x01';
      (pnStack_10->intf).state = '\x01';
      (pnStack_10->intf).up = (ndn_face_intf_up)0x0;
      (pnStack_10->intf).down = ndn_unix_slave_face_down;
      (pnStack_10->intf).send = ndn_unix_face_send;
      (pnStack_10->intf).destroy = (ndn_face_intf_destroy)0x0;
      pnStack_10->client = false;
      pnStack_10->sock = sock;
      pnStack_10->offset = 0;
      pnVar2 = ndn_msgqueue_post(pnStack_10,ndn_unix_face_recv,0,(void *)0x0);
      pnStack_10->process_event = pnVar2;
      if (pnStack_10->process_event == (ndn_msg *)0x0) {
        ndn_face_down((ndn_face_intf_t *)pnStack_10);
        pnStack_10 = (ndn_unix_face_t *)0x0;
      }
    }
    else {
      free(pnStack_10);
      pnStack_10 = (ndn_unix_face_t *)0x0;
    }
  }
  return pnStack_10;
}

Assistant:

static ndn_unix_face_t*
ndn_unix_slave_face_construct(int sock){
  ndn_unix_face_t* ret;
  int iret;

  ret = (ndn_unix_face_t*)malloc(sizeof(ndn_unix_face_t));
  if(!ret){
    return NULL;
  }

  ret->intf.face_id = NDN_INVALID_ID;
  iret = ndn_forwarder_register_face(&ret->intf);
  if(iret != NDN_SUCCESS){
    free(ret);
    return NULL;
  }
  //printf("New face registered %d\n", ret->intf.face_id);

  ret->intf.type = NDN_FACE_TYPE_APP;
  ret->intf.state = NDN_FACE_STATE_UP;
  ret->intf.up = NULL;
  ret->intf.down = ndn_unix_slave_face_down;
  ret->intf.send = ndn_unix_face_send;
  ret->intf.destroy = NULL;

  ret->client = false;
  ret->sock = sock;
  ret->offset = 0;
  ret->process_event = ndn_msgqueue_post(ret, ndn_unix_face_recv, 0, NULL);
  if(ret->process_event == NULL){
    ndn_face_down(&ret->intf);
    return NULL;
  }

  return ret;
}